

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  string *this;
  Player *this_00;
  Printer printer;
  Board board;
  
  Board::Board(&board,9);
  this = (string *)operator_new(0x20);
  Player::Player((Player *)this);
  this_00 = (Player *)operator_new(0x20);
  Player::Player(this_00);
  Printer::Printer(&printer,'.','x','o');
  Board::playAt(&board,0,0,(Player *)this);
  Board::playAt(&board,4,5,this_00);
  Board::playAt(&board,6,7,(Player *)this);
  Printer::printBoard(&printer,&board,(Player *)this);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  Board::removeStone(&board,0,0);
  Printer::printBoard(&printer,&board,(Player *)this);
  std::__cxx11::string::~string(this);
  operator_delete(this);
  Board::~Board(&board);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    // dummy client code for demonstration so far

    int n = 9;
    Board board = Board(n);


    Player *p1 = new Player(),
        *p2 = new Player();
    Printer printer = Printer();


    board.playAt(0,0, p1);
    board.playAt(4,5, p2);
    board.playAt(6,7, p1);


    printer.printBoard(board, p1);
    cout << endl; cout << endl;


    board.removeStone(0,0);
    printer.printBoard(board, p1);

    delete p1, p2;
    return 0;
}